

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::
base_checker<phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::multimap<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
::erase(base_checker<phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::multimap<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
        *this,iterator begin,iterator end)

{
  int iVar1;
  _Base_ptr p_Var2;
  const_iterator __first;
  _Rb_tree_node_base *p_Var3;
  const_iterator __last;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar4;
  long lVar5;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar6;
  int iVar7;
  char *pcVar8;
  base_checker<phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::multimap<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  *this_00;
  iterator iVar9;
  iterator _end;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  int local_5c;
  undefined1 local_58 [8];
  int local_50;
  undefined4 uStack_4c;
  base_checker<phmap::btree_multimap<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::multimap<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  *local_40;
  size_type local_38;
  
  pbVar4 = end.node;
  pbVar6 = begin.node;
  local_38 = (this->tree_).
             super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
             .
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
             .tree_.size_;
  local_5c = begin.position;
  iVar7 = end.position;
  local_58 = (undefined1  [8])pbVar6;
  local_50 = local_5c;
  if (local_5c == iVar7 && pbVar6 == pbVar4) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    do {
      do {
        lVar5 = lVar5 + 0x100000000;
        btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
        ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                     *)local_58);
      } while (local_58 != (undefined1  [8])pbVar4);
    } while (local_50 != iVar7);
    lVar5 = lVar5 >> 0x20;
  }
  if (((undefined1  [16])begin & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
LAB_002447d0:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                 );
  }
  p_Var2 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __last._M_node = &(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
  __first._M_node = __last._M_node;
  if (p_Var2 != (_Base_ptr)0x0) {
    iVar1 = *(int *)(pbVar6 + (long)local_5c * 8 + 0xc);
    do {
      if (iVar1 <= (int)p_Var2[1]._M_color) {
        __first._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < iVar1];
    } while (p_Var2 != (_Base_ptr)0x0);
  }
  local_40 = this;
  iVar9 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          ::lower_bound<int>((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                              *)this,(int *)(pbVar6 + (long)local_5c * 8 + 0xc));
  local_58 = (undefined1  [8])iVar9.node;
  local_50 = iVar9.position;
  if (local_50 != local_5c || local_58 != (undefined1  [8])pbVar6) {
    do {
      do {
        __first._M_node = (_Base_ptr)std::_Rb_tree_increment(__first._M_node);
        btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
        ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                     *)local_58);
      } while (local_58 != (undefined1  [8])pbVar6);
    } while (local_50 != local_5c);
  }
  this_00 = local_40;
  iVar9 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          ::end((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)local_40);
  if (iVar9.node != pbVar4 || iVar9.position != iVar7) {
    if (((undefined1  [16])end & (undefined1  [16])0x7) != (undefined1  [16])0x0) goto LAB_002447d0;
    p_Var3 = (this_00->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 != (_Rb_tree_node_base *)0x0) {
      do {
        if (*(int *)(pbVar4 + (long)iVar7 * 8 + 0xc) <= (int)p_Var3[1]._M_color) {
          __last._M_node = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)
                 [(int)p_Var3[1]._M_color < *(int *)(pbVar4 + (long)iVar7 * 8 + 0xc)];
      } while (p_Var3 != (_Base_ptr)0x0);
    }
  }
  iVar9 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          ::end((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 *)this_00);
  if (iVar9.position != iVar7 || iVar9.node != pbVar4) {
    if (((undefined1  [16])end & (undefined1  [16])0x7) != (undefined1  [16])0x0) goto LAB_002447d0;
    iVar9 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
            ::lower_bound<int>((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                                *)this_00,(int *)(pbVar4 + (long)iVar7 * 8 + 0xc));
    local_58 = (undefined1  [8])iVar9.node;
    local_50 = iVar9.position;
    this_00 = local_40;
    if (local_50 != iVar7 || local_58 != (undefined1  [8])pbVar4) {
      do {
        do {
          __last._M_node = (_Base_ptr)std::_Rb_tree_increment(__last._M_node);
          btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
          ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                       *)local_58);
        } while (local_58 != (undefined1  [8])pbVar4);
        this_00 = local_40;
      } while (local_50 != iVar7);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_M_erase_aux(&(this_00->checker_)._M_t,__first,__last);
  iVar9.position = local_5c;
  iVar9.node = pbVar6;
  iVar9._12_4_ = 0;
  _end._12_4_ = 0;
  _end.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
               *)SUB128(end._0_12_,0);
  _end.position = SUB124(end._0_12_,8);
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  ::erase((pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
           *)local_58,
          (btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
           *)this_00,iVar9,_end);
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this_00->tree_).
       super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
       .
       super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
       .
       super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
       .tree_.size_;
  local_68.data_ =
       (AssertHelperData *)(this_00->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_58,"tree_.size()","checker_.size()",(unsigned_long *)&local_70,
             (unsigned_long *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT44(uStack_4c,local_50) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(uStack_4c,local_50);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x103,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_4c,local_50) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_4c,local_50));
  }
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this_00->tree_).
       super_btree_multimap_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
       .
       super_btree_multiset_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
       .
       super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>_>
       .tree_.size_;
  local_68.data_ = (AssertHelperData *)(local_38 - lVar5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_58,"tree_.size()","size - count",(unsigned_long *)&local_70,
             (unsigned_long *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT44(uStack_4c,local_50) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(uStack_4c,local_50);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x104,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_4c,local_50) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_4c,local_50));
  }
  return;
}

Assistant:

void erase(iterator begin, iterator end) {
        size_t size = tree_.size();
        int count = std::distance(begin, end);
        auto checker_begin = checker_.lower_bound(begin.key());
        for (iterator tmp(tree_.lower_bound(begin.key())); tmp != begin; ++tmp) {
            ++checker_begin;
        }
        auto checker_end =
            end == tree_.end() ? checker_.end() : checker_.lower_bound(end.key());
        if (end != tree_.end()) {
            for (iterator tmp(tree_.lower_bound(end.key())); tmp != end; ++tmp) {
                ++checker_end;
            }
        }
        checker_.erase(checker_begin, checker_end);
        tree_.erase(begin, end);
        EXPECT_EQ(tree_.size(), checker_.size());
        EXPECT_EQ(tree_.size(), size - count);
    }